

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycled.hpp
# Opt level: O1

ostream * Lib::operator<<(ostream *out,
                         Recycled<Kernel::Renaming,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                         *self)

{
  _Head_base<0UL,_Kernel::Renaming_*,_false> self_00;
  ostream *poVar1;
  
  self_00._M_head_impl =
       (self->_self)._M_t.
       super___uniq_ptr_impl<Kernel::Renaming,_std::default_delete<Kernel::Renaming>_>._M_t.
       super__Tuple_impl<0UL,_Kernel::Renaming_*,_std::default_delete<Kernel::Renaming>_>.
       super__Head_base<0UL,_Kernel::Renaming_*,_false>._M_head_impl;
  if (self_00._M_head_impl != (Renaming *)0x0) {
    poVar1 = operator<<(out,&(self_00._M_head_impl)->_data);
    return poVar1;
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"Recycled(NULL)",0xe);
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, Recycled const& self)
  { if (self.alive())return out << self.self(); else return out << "Recycled(NULL)"; }